

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyHelpers.cpp
# Opt level: O2

void btSoftBodyHelpers::Draw(btSoftBody *psb,btIDebugDraw *idraw,int drawflags)

{
  long *plVar1;
  float fVar2;
  Face *pFVar3;
  long lVar4;
  long lVar5;
  Link *pLVar6;
  Note *pNVar7;
  Joint *pJVar8;
  Node *pNVar9;
  Tetra *pTVar10;
  long lVar11;
  uint uVar12;
  btScalar abVar13 [4];
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  btTransform *pbVar18;
  long lVar19;
  btVector3 *pbVar20;
  btScalar *s;
  long lVar21;
  long lVar22;
  float fVar23;
  btScalar bVar24;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  btScalar extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar25;
  float fVar26;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  btScalar in_XMM1 [4];
  undefined8 uVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  float fVar30;
  float fVar31;
  btVector3 bVar32;
  btVector3 bVar33;
  btVector3 local_1e8;
  uint local_1cc;
  btVector3 x;
  btVector3 local_1a8;
  btScalar nscl;
  undefined1 local_188 [16];
  btScalar local_178 [4];
  undefined1 local_168 [12];
  float fStack_15c;
  undefined1 local_158 [16];
  btVector3 d;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  ulong uStack_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  nscl = 0.5;
  local_48 = 0;
  uStack_40 = 0;
  local_b8 = 0x3f8000003f800000;
  uStack_b0 = 0x3f800000;
  local_58 = 0x3f800000;
  uStack_50 = 0;
  local_1cc = drawflags;
  if (((uint)drawflags >> 8 & 1) == 0) {
    if ((drawflags & 1U) != 0) {
      lVar21 = 0x10;
      for (lVar19 = 0; uVar29 = in_XMM1._8_8_, lVar19 < (psb->m_nodes).m_size; lVar19 = lVar19 + 1)
      {
        pNVar9 = (psb->m_nodes).m_data;
        if ((*(byte *)(*(long *)((long)(pNVar9->m_x).m_floats + lVar21 + -0x18) + 0x14) & 1) != 0) {
          pbVar20 = (btVector3 *)
                    ((long)&(((Node *)(&pNVar9->m_x + -1))->super_Feature).super_Element.m_tag +
                    lVar21);
          x.m_floats = (btScalar  [4])ZEXT816(0x3dcccccd);
          d = operator-(pbVar20,&x);
          local_1a8.m_floats = (btScalar  [4])ZEXT816(0x3dcccccd);
          local_1e8 = operator+(pbVar20,&local_1a8);
          local_c8 = 0x3f800000;
          uStack_c0 = 0;
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&d,&local_1e8);
          x.m_floats = (btScalar  [4])ZEXT816(0x3dcccccd00000000);
          d = operator-(pbVar20,&x);
          local_1a8.m_floats = (btScalar  [4])ZEXT816(0x3dcccccd00000000);
          local_1e8 = operator+(pbVar20,&local_1a8);
          local_c8 = 0x3f80000000000000;
          uStack_c0 = 0;
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&d,&local_1e8,&local_c8);
          x.m_floats = (btScalar  [4])(ZEXT816(0x3dcccccd) << 0x40);
          d = operator-(pbVar20,&x);
          local_1a8.m_floats = (btScalar  [4])(ZEXT816(0x3dcccccd) << 0x40);
          local_1e8 = operator+(pbVar20,&local_1a8);
          in_XMM1._0_8_ = local_1e8.m_floats._8_8_;
          in_XMM1[2] = (btScalar)(int)uVar29;
          in_XMM1[3] = (btScalar)(int)((ulong)uVar29 >> 0x20);
          local_c8 = 0;
          uStack_c0 = 0x3f800000;
          (*idraw->_vptr_btIDebugDraw[4])(idraw,&d,&local_1e8,&local_c8);
        }
        lVar21 = lVar21 + 0x78;
      }
    }
    if ((local_1cc & 2) != 0) {
      lVar21 = 0x18;
      for (lVar19 = 0; lVar19 < (psb->m_links).m_size; lVar19 = lVar19 + 1) {
        pLVar6 = (psb->m_links).m_data;
        if ((*(byte *)(*(long *)((long)pLVar6->m_n + lVar21 + -0x20) + 0x14) & 1) != 0) {
          (*idraw->_vptr_btIDebugDraw[4])
                    (idraw,*(long *)((long)pLVar6->m_n + lVar21 + -0x18) + 0x10,
                     *(long *)((long)pLVar6->m_n + lVar21 + -0x10) + 0x10,&local_48);
        }
        lVar21 = lVar21 + 0x48;
      }
    }
    if ((local_1cc & 0x10) != 0) {
      lVar21 = 0x50;
      for (lVar19 = 0; lVar19 < (psb->m_nodes).m_size; lVar19 = lVar19 + 1) {
        pNVar9 = (psb->m_nodes).m_data;
        if ((*(byte *)(*(long *)((long)(pNVar9->m_x).m_floats + lVar21 + -0x58) + 0x14) & 1) != 0) {
          d = operator*((btVector3 *)
                        ((long)&(((Node *)(&pNVar9->m_x + -1))->super_Feature).super_Element.m_tag +
                        lVar21),&nscl);
          pbVar20 = (btVector3 *)((long)(&pNVar9->m_x + -5) + lVar21);
          x = operator+(pbVar20,&d);
          (*idraw->_vptr_btIDebugDraw[4])(idraw,pbVar20,&x,&local_b8);
          x = operator-(pbVar20,&d);
          in_XMM1 = (btScalar  [4])ZEXT416((uint)((float)uStack_b0 * 0.5));
          local_1e8.m_floats[1] = (float)((ulong)local_b8 >> 0x20) * 0.5;
          local_1e8.m_floats[0] = (float)local_b8 * 0.5;
          local_1e8.m_floats[2] = (float)uStack_b0 * 0.5;
          local_1e8.m_floats[3] = 0.0;
          (*idraw->_vptr_btIDebugDraw[4])(idraw,pbVar20,&x,&local_1e8);
        }
        lVar21 = lVar21 + 0x78;
      }
    }
    if ((local_1cc & 0x20) != 0) {
      if (Draw(btSoftBody*,btIDebugDraw*,int)::axis == '\0') {
        iVar16 = __cxa_guard_acquire(&Draw(btSoftBody*,btIDebugDraw*,int)::axis);
        in_XMM1[2] = (btScalar)(int)extraout_XMM1_Qb;
        in_XMM1[3] = (btScalar)(int)((ulong)extraout_XMM1_Qb >> 0x20);
        in_XMM1[0] = (float)(int)extraout_XMM1_Qa;
        in_XMM1[1] = (float)(int)((ulong)extraout_XMM1_Qa >> 0x20);
        if (iVar16 != 0) {
          Draw::axis[0].m_floats[0] = 1.0;
          Draw::axis[0].m_floats[1] = 0.0;
          Draw::axis[0].m_floats[2] = 0.0;
          Draw::axis[0].m_floats[3] = 0.0;
          Draw::axis[1].m_floats[0] = 0.0;
          Draw::axis[1].m_floats[1] = 1.0;
          Draw::axis[1].m_floats[2] = 0.0;
          Draw::axis[1].m_floats[3] = 0.0;
          Draw::axis[2].m_floats[0] = 0.0;
          Draw::axis[2].m_floats[1] = 0.0;
          Draw::axis[2].m_floats[2] = 1.0;
          Draw::axis[2].m_floats[3] = 0.0;
          __cxa_guard_release(&Draw(btSoftBody*,btIDebugDraw*,int)::axis);
          in_XMM1[2] = (btScalar)(int)extraout_XMM1_Qb_00;
          in_XMM1[3] = (btScalar)(int)((ulong)extraout_XMM1_Qb_00 >> 0x20);
          in_XMM1[0] = (float)(int)extraout_XMM1_Qa_00;
          in_XMM1[1] = (float)(int)((ulong)extraout_XMM1_Qa_00 >> 0x20);
        }
      }
      lVar21 = 0x20;
      for (lVar19 = 0; uVar29 = in_XMM1._8_8_, lVar19 < (psb->m_rcontacts).m_size;
          lVar19 = lVar19 + 1) {
        plVar1 = (long *)((long)(((psb->m_rcontacts).m_data)->m_cti).m_normal.m_floats + lVar21 + -8
                         );
        pbVar20 = (btVector3 *)(plVar1 + -3);
        lVar22 = *plVar1;
        local_178[0] = (btScalar)(int)lVar21;
        local_178[1] = (btScalar)(int)((ulong)lVar21 >> 0x20);
        bVar24 = btVector3::dot((btVector3 *)(lVar22 + 0x10),pbVar20);
        local_1e8.m_floats[0] = bVar24 + *(float *)(plVar1 + -1);
        x = operator*(pbVar20,local_1e8.m_floats);
        d = operator-((btVector3 *)(lVar22 + 0x10),&x);
        iVar16 = btVector3::minAxis(pbVar20);
        local_1e8 = btVector3::cross(pbVar20,Draw::axis + iVar16);
        x = btVector3::normalized(&local_1e8);
        local_1e8 = btVector3::cross(&x,pbVar20);
        bVar32 = btVector3::normalized(&local_1e8);
        local_188._8_4_ = extraout_XMM0_Dc;
        local_188._0_4_ = (int)bVar32.m_floats._0_8_;
        local_188._4_4_ = (int)((ulong)bVar32.m_floats._0_8_ >> 0x20);
        local_188._12_4_ = extraout_XMM0_Dd;
        local_168._8_4_ = (int)uVar29;
        fStack_15c = (float)(int)((ulong)uVar29 >> 0x20);
        local_168._0_4_ = (int)bVar32.m_floats._8_8_;
        local_168._4_4_ = (int)((ulong)bVar32.m_floats._8_8_ >> 0x20);
        fVar30 = nscl * x.m_floats[0];
        fVar31 = nscl * x.m_floats[1];
        local_1e8.m_floats[1] = d.m_floats[1] - fVar31;
        local_1e8.m_floats[0] = d.m_floats[0] - fVar30;
        local_1e8.m_floats[2] = d.m_floats[2] - x.m_floats[2] * nscl;
        local_1e8.m_floats[3] = 0.0;
        local_1a8.m_floats[1] = fVar31 + d.m_floats[1];
        local_1a8.m_floats[0] = fVar30 + d.m_floats[0];
        local_1a8.m_floats[2] = x.m_floats[2] * nscl + d.m_floats[2];
        local_1a8.m_floats[3] = 0.0;
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_1e8,&local_1a8,&local_58);
        local_1e8.m_floats[0] = d.m_floats[0] - nscl * (float)local_188._0_4_;
        local_1e8.m_floats[1] = d.m_floats[1] - nscl * (float)local_188._4_4_;
        local_1e8.m_floats[2] = d.m_floats[2] - (float)local_168._0_4_ * nscl;
        local_1e8.m_floats[3] = 0.0;
        uVar29 = 0;
        local_1a8.m_floats[1] = nscl * (float)local_188._4_4_ + d.m_floats[1];
        local_1a8.m_floats[0] = nscl * (float)local_188._0_4_ + d.m_floats[0];
        local_1a8.m_floats[2] = (float)local_168._0_4_ * nscl + d.m_floats[2];
        local_1a8.m_floats[3] = 0.0;
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&local_1e8,&local_1a8,&local_58);
        bVar32 = operator*(pbVar20,&nscl);
        auVar27._0_8_ = bVar32.m_floats._8_8_;
        auVar27._8_8_ = uVar29;
        in_XMM1._4_12_ = auVar27._4_12_;
        local_1e8.m_floats[0] = d.m_floats[0] + bVar32.m_floats[0] * 3.0;
        local_1e8.m_floats[1] = d.m_floats[1] + bVar32.m_floats[1] * 3.0;
        in_XMM1[0] = bVar32.m_floats[2] * 3.0 + d.m_floats[2];
        local_1e8.m_floats[2] = in_XMM1[0];
        local_1e8.m_floats[3] = 0.0;
        local_1a8.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&d,&local_1e8,&local_1a8);
        lVar21 = local_178._0_8_ + 0x78;
      }
    }
    if ((local_1cc & 4) != 0) {
      d.m_floats = (btScalar  [4])ZEXT816(0x3f33333300000000);
      lVar21 = 0x20;
      for (lVar19 = 0; lVar19 < (psb->m_faces).m_size; lVar19 = lVar19 + 1) {
        pFVar3 = (psb->m_faces).m_data;
        if ((*(byte *)(*(long *)((long)pFVar3->m_n + lVar21 + -0x28) + 0x14) & 1) != 0) {
          lVar22 = *(long *)((long)pFVar3->m_n + lVar21 + -0x20);
          lVar4 = *(long *)((long)pFVar3->m_n + lVar21 + -0x18);
          fVar30 = *(float *)(lVar22 + 0x18);
          fVar31 = *(float *)(lVar4 + 0x18);
          _local_168 = (btScalar  [4])ZEXT416((uint)fVar31);
          lVar5 = *(long *)((long)pFVar3->m_n + lVar21 + -0x10);
          fVar23 = *(float *)(lVar5 + 0x18);
          local_188 = ZEXT416((uint)fVar23);
          uVar29 = *(undefined8 *)(lVar22 + 0x10);
          local_158._0_8_ = *(ulong *)(lVar4 + 0x10);
          local_158._8_8_ = 0;
          uVar17 = *(ulong *)(lVar5 + 0x10);
          local_178[2] = 0.0;
          local_178[3] = 0.0;
          local_178[0] = (btScalar)(int)uVar17;
          local_178[1] = (btScalar)(int)(uVar17 >> 0x20);
          fVar25 = (float)uVar29;
          fVar2 = (float)((ulong)uVar29 >> 0x20);
          x.m_floats[0] = fVar25 + (float)local_158._0_8_ + (float)uVar17;
          x.m_floats[1] = fVar2 + (float)((ulong)local_158._0_8_ >> 0x20) + (float)(uVar17 >> 0x20);
          fVar23 = fVar30 + fVar31 + fVar23;
          uVar17 = (ulong)(uint)fVar23;
          x.m_floats[2] = fVar23;
          x.m_floats[3] = 0.0;
          local_1e8.m_floats[0] = 3.0;
          bVar32 = operator/(&x,local_1e8.m_floats);
          in_XMM1._0_8_ = bVar32.m_floats._8_8_;
          in_XMM1[2] = (btScalar)(int)uVar17;
          in_XMM1[3] = (btScalar)(int)(uVar17 >> 0x20);
          fVar31 = bVar32.m_floats[0];
          fVar23 = bVar32.m_floats[1];
          fVar26 = bVar32.m_floats[2];
          x.m_floats[1] = (fVar2 - fVar23) * 0.8 + fVar23;
          x.m_floats[0] = (fVar25 - fVar31) * 0.8 + fVar31;
          x.m_floats[2] = (fVar30 - fVar26) * 0.8 + fVar26;
          x.m_floats[3] = 0.0;
          local_1e8.m_floats[1] = ((float)local_158._4_4_ - fVar23) * 0.8 + fVar23;
          local_1e8.m_floats[0] = ((float)local_158._0_4_ - fVar31) * 0.8 + fVar31;
          local_1e8.m_floats[2] = ((float)local_168._0_4_ - fVar26) * 0.8 + fVar26;
          local_1e8.m_floats[3] = 0.0;
          local_1a8.m_floats[1] = (local_178[1] - fVar23) * 0.8 + fVar23;
          local_1a8.m_floats[0] = (local_178[0] - fVar31) * 0.8 + fVar31;
          local_1a8.m_floats[2] = (local_188._0_4_ - fVar26) * 0.8 + fVar26;
          local_1a8.m_floats[3] = 0.0;
          (*idraw->_vptr_btIDebugDraw[9])(0x3f800000,idraw,&x,&local_1e8,&local_1a8,&d);
        }
        lVar21 = lVar21 + 0x48;
      }
    }
    if ((local_1cc & 8) != 0) {
      d.m_floats[2] = 0.7;
      d.m_floats[0] = 0.3;
      d.m_floats[1] = 0.3;
      d.m_floats[3] = 0.0;
      lVar21 = 0x28;
      for (lVar19 = 0; lVar19 < (psb->m_tetras).m_size; lVar19 = lVar19 + 1) {
        pTVar10 = (psb->m_tetras).m_data;
        if ((*(byte *)(*(long *)((long)pTVar10->m_n + lVar21 + -0x30) + 0x14) & 1) != 0) {
          lVar22 = *(long *)((long)pTVar10->m_n + lVar21 + -0x28);
          lVar4 = *(long *)((long)pTVar10->m_n + lVar21 + -0x20);
          fVar30 = *(float *)(lVar22 + 0x18);
          local_88 = ZEXT416((uint)fVar30);
          fVar31 = *(float *)(lVar4 + 0x18);
          local_78 = ZEXT416((uint)fVar31);
          lVar5 = *(long *)((long)pTVar10->m_n + lVar21 + -0x18);
          fVar23 = *(float *)(lVar5 + 0x18);
          local_68 = ZEXT416((uint)fVar23);
          lVar11 = *(long *)((long)pTVar10->m_n + lVar21 + -0x10);
          fVar2 = *(float *)(lVar11 + 0x18);
          uVar17 = *(ulong *)(lVar22 + 0x10);
          local_178[2] = 0.0;
          local_178[3] = 0.0;
          local_178[0] = (btScalar)(int)uVar17;
          local_178[1] = (btScalar)(int)(uVar17 >> 0x20);
          local_168._0_8_ = *(ulong *)(lVar4 + 0x10);
          stack0xfffffffffffffea0 = 0;
          local_158._0_8_ = *(ulong *)(lVar5 + 0x10);
          local_158._8_8_ = 0;
          local_188._0_8_ = *(ulong *)(lVar11 + 0x10);
          local_188._8_8_ = 0;
          x.m_floats[0] =
               (float)uVar17 + (float)local_168._0_8_ + (float)local_158._0_8_ +
               (float)local_188._0_8_;
          x.m_floats[1] =
               (float)(uVar17 >> 0x20) + (float)((ulong)local_168._0_8_ >> 0x20) +
               (float)((ulong)local_158._0_8_ >> 0x20) + (float)((ulong)local_188._0_8_ >> 0x20);
          fVar30 = fVar30 + fVar31 + fVar23 + fVar2;
          uVar17 = (ulong)(uint)fVar30;
          x.m_floats[2] = fVar30;
          x.m_floats[3] = 0.0;
          local_1e8.m_floats[0] = 4.0;
          bVar32 = operator/(&x,local_1e8.m_floats);
          local_a8 = bVar32.m_floats._8_8_;
          fVar30 = bVar32.m_floats[0];
          fVar31 = bVar32.m_floats[1];
          fVar23 = bVar32.m_floats[2];
          x.m_floats[0] = (local_178[0] - fVar30) * 0.8 + fVar30;
          x.m_floats[1] = (local_178[1] - fVar31) * 0.8 + fVar31;
          x.m_floats[2] = ((float)local_88._0_4_ - fVar23) * 0.8 + fVar23;
          x.m_floats[3] = 0.0;
          local_1e8.m_floats[0] = ((float)local_168._0_4_ - fVar30) * 0.8 + fVar30;
          local_1e8.m_floats[1] = ((float)local_168._4_4_ - fVar31) * 0.8 + fVar31;
          local_1e8.m_floats[2] = ((float)local_78._0_4_ - fVar23) * 0.8 + fVar23;
          local_1e8.m_floats[3] = 0.0;
          local_98._8_4_ = extraout_XMM0_Dc_02;
          local_98._0_8_ = bVar32.m_floats._0_8_;
          local_98._12_4_ = extraout_XMM0_Dd_02;
          fVar30 = ((float)local_158._0_4_ - fVar30) * 0.8 + fVar30;
          fVar31 = ((float)local_158._4_4_ - fVar31) * 0.8 + fVar31;
          fVar23 = ((float)local_68._0_4_ - fVar23) * 0.8 + fVar23;
          local_158._4_4_ = fVar31;
          local_158._0_4_ = fVar30;
          local_158._8_4_ = fVar23;
          local_158._12_4_ = 0.0;
          local_1a8.m_floats[1] = fVar31;
          local_1a8.m_floats[0] = fVar30;
          local_1a8.m_floats[2] = fVar23;
          local_1a8.m_floats[3] = 0.0;
          local_178 = x.m_floats;
          _local_168 = local_1e8.m_floats;
          uStack_a0 = uVar17;
          (*idraw->_vptr_btIDebugDraw[9])(0x3f800000,idraw,&x,&local_1e8,&local_1a8,&d);
          abVar13 = _local_168;
          x.m_floats[0] = local_178[0];
          x.m_floats[1] = local_178[1];
          x.m_floats[2] = local_178[2];
          x.m_floats[3] = local_178[3];
          local_1e8.m_floats[0] = (btScalar)local_168._0_4_;
          local_1e8.m_floats[1] = (btScalar)local_168._4_4_;
          local_1e8.m_floats[2] = (btScalar)local_168._8_4_;
          local_1e8.m_floats[3] = fStack_15c;
          in_XMM1[0] = ((float)local_188._0_4_ - (float)local_98._0_4_) * 0.8 +
                       (float)local_98._0_4_;
          in_XMM1[1] = ((float)local_188._4_4_ - (float)local_98._4_4_) * 0.8 +
                       (float)local_98._4_4_;
          in_XMM1[2] = (fVar2 - (float)local_a8) * 0.8 + (float)local_a8;
          in_XMM1[3] = 0.0;
          local_1a8.m_floats = in_XMM1;
          local_188 = (undefined1  [16])in_XMM1;
          _local_168 = abVar13;
          (*idraw->_vptr_btIDebugDraw[9])(0x3f800000,idraw,&x,&local_1e8,&local_1a8,&d);
          auVar28 = local_158;
          auVar27 = local_188;
          x.m_floats[0] = (btScalar)local_168._0_4_;
          x.m_floats[1] = (btScalar)local_168._4_4_;
          x.m_floats[2] = (btScalar)local_168._8_4_;
          x.m_floats[3] = fStack_15c;
          local_1e8.m_floats[0] = (btScalar)local_158._0_4_;
          local_1e8.m_floats[1] = (btScalar)local_158._4_4_;
          local_1e8.m_floats[2] = (btScalar)local_158._8_4_;
          local_1e8.m_floats[3] = (btScalar)local_158._12_4_;
          local_1a8.m_floats[0] = (btScalar)local_188._0_4_;
          local_1a8.m_floats[1] = (btScalar)local_188._4_4_;
          local_1a8.m_floats[2] = (btScalar)local_188._8_4_;
          local_1a8.m_floats[3] = (btScalar)local_188._12_4_;
          local_188 = auVar27;
          local_158 = auVar28;
          (*idraw->_vptr_btIDebugDraw[9])(0x3f800000,idraw,&x,&local_1e8,&local_1a8,&d);
          x.m_floats[0] = (btScalar)local_158._0_4_;
          x.m_floats[1] = (btScalar)local_158._4_4_;
          x.m_floats[2] = (btScalar)local_158._8_4_;
          x.m_floats[3] = (btScalar)local_158._12_4_;
          local_1e8.m_floats[0] = local_178[0];
          local_1e8.m_floats[1] = local_178[1];
          local_1e8.m_floats[2] = local_178[2];
          local_1e8.m_floats[3] = local_178[3];
          local_1a8.m_floats[0] = (btScalar)local_188._0_4_;
          local_1a8.m_floats[1] = (btScalar)local_188._4_4_;
          local_1a8.m_floats[2] = (btScalar)local_188._8_4_;
          local_1a8.m_floats[3] = (btScalar)local_188._12_4_;
          (*idraw->_vptr_btIDebugDraw[9])(0x3f800000,idraw,&x,&local_1e8,&local_1a8,&d);
        }
        lVar21 = lVar21 + 0x88;
      }
    }
  }
  else {
    srand(0x70e);
    for (lVar21 = 0; lVar21 < (psb->m_clusters).m_size; lVar21 = lVar21 + 1) {
      if ((psb->m_clusters).m_data[lVar21]->m_collide == true) {
        iVar16 = rand();
        iVar14 = rand();
        iVar15 = rand();
        local_1e8.m_floats[1] = (float)iVar14 * 4.656613e-10;
        local_1e8.m_floats[0] = (float)iVar16 * 4.656613e-10;
        local_1e8.m_floats[2] = (float)iVar15 * 4.656613e-10;
        local_1e8.m_floats[3] = 0.0;
        bVar32 = btVector3::normalized(&local_1e8);
        x.m_floats[1] = 0.0;
        x.m_floats[2] = 0.0;
        local_1e8.m_floats[1] = bVar32.m_floats[1] * 0.75;
        local_1e8.m_floats[0] = bVar32.m_floats[0] * 0.75;
        local_1e8.m_floats[2] = bVar32.m_floats[2] * 0.75;
        local_1e8.m_floats[3] = 0.0;
        local_188._0_8_ = lVar21;
        btAlignedObjectArray<btVector3>::resize
                  ((btAlignedObjectArray<btVector3> *)&x,
                   ((psb->m_clusters).m_data[lVar21]->m_nodes).m_size,&d);
        uVar17 = (ulong)(uint)x.m_floats[1];
        if ((int)x.m_floats[1] < 1) {
          uVar17 = 0;
        }
        for (lVar21 = 0; uVar17 * 8 != lVar21; lVar21 = lVar21 + 8) {
          lVar19 = *(long *)((long)((psb->m_clusters).m_data[local_188._0_8_]->m_nodes).m_data +
                            lVar21);
          uVar29 = *(undefined8 *)(lVar19 + 0x18);
          *(undefined8 *)(lVar21 * 2) = *(undefined8 *)(lVar19 + 0x10);
          ((undefined8 *)(lVar21 * 2))[1] = uVar29;
        }
        d.m_floats[1] = 0.0;
        d.m_floats[2] = 0.0;
        in_XMM1._0_12_ = ZEXT812(0);
        in_XMM1[3] = 0.0;
        btConvexHullComputer::compute
                  ((btConvexHullComputer *)&d,(float *)0x0,0x10,(int)x.m_floats[1],0.0,0.0);
        lVar21 = 0;
        while (lVar21 < 0) {
          local_178[0] = (btScalar)(int)lVar21;
          local_178[1] = (btScalar)(int)((ulong)lVar21 >> 0x20);
          lVar19 = (long)*(int *)(lVar21 * 4) * 0xc;
          lVar21 = (long)*(int *)(lVar19 + 4) * 0xc;
          iVar16 = *(int *)(lVar21 + 8 + lVar19);
          uVar17 = (ulong)*(uint *)(lVar19 + 8);
          for (lVar21 = (long)*(int *)(lVar21 + lVar19) * 0xc + lVar21 + lVar19; lVar21 != lVar19;
              lVar21 = (long)*(int *)(lVar21 + lVar22) * 0xc + lVar21 + lVar22) {
            iVar14 = *(int *)(lVar21 + 8);
            lVar22 = (long)iVar16;
            iVar16 = (int)uVar17;
            (*idraw->_vptr_btIDebugDraw[9])
                      (0x3f800000,idraw,lVar22 * 0x10,(long)iVar16 * 0x10,(long)iVar14 * 0x10,
                       &local_1e8);
            lVar22 = (long)*(int *)(lVar21 + 4) * 0xc;
            uVar17 = (long)iVar14;
          }
          lVar21 = local_178._0_8_ + 1;
        }
        btConvexHullComputer::~btConvexHullComputer((btConvexHullComputer *)&d);
        btAlignedObjectArray<btVector3>::~btAlignedObjectArray
                  ((btAlignedObjectArray<btVector3> *)&x);
        lVar21 = local_188._0_8_;
      }
    }
  }
  if ((local_1cc & 0x40) != 0) {
    lVar21 = 0;
    for (lVar19 = 0; uVar29 = in_XMM1._8_8_, lVar19 < (psb->m_anchors).m_size; lVar19 = lVar19 + 1)
    {
      plVar1 = (long *)((long)(((psb->m_anchors).m_data)->m_local).m_floats + lVar21 + -8);
      d = btTransform::operator()((btTransform *)(plVar1[3] + 8),(btVector3 *)(plVar1 + 1));
      in_XMM1._0_8_ = d.m_floats._8_8_;
      in_XMM1[2] = (btScalar)(int)uVar29;
      in_XMM1[3] = (btScalar)(int)((ulong)uVar29 >> 0x20);
      x.m_floats = (btScalar  [4])ZEXT816(0x3f800000);
      drawVertex(idraw,(btVector3 *)(*plVar1 + 0x10),0.25,&x);
      x.m_floats = (btScalar  [4])ZEXT816(0x3f80000000000000);
      drawVertex(idraw,&d,0.25,&x);
      x.m_floats[2] = 1.0;
      x.m_floats[0] = 1.0;
      x.m_floats[1] = 1.0;
      x.m_floats[3] = 0.0;
      (*idraw->_vptr_btIDebugDraw[4])(idraw,*plVar1 + 0x10,&d,&x);
      lVar21 = lVar21 + 0x68;
    }
    lVar21 = 0x60;
    for (lVar19 = 0; lVar19 < (psb->m_nodes).m_size; lVar19 = lVar19 + 1) {
      pNVar9 = (psb->m_nodes).m_data;
      if (((*(byte *)(*(long *)((long)(pNVar9->m_x).m_floats + lVar21 + -0x68) + 0x14) & 1) != 0) &&
         (*(float *)((long)&(((Node *)(&pNVar9->m_x + -1))->super_Feature).super_Element.m_tag +
                    lVar21) <= 0.0)) {
        d.m_floats = (btScalar  [4])ZEXT816(0x3f800000);
        drawVertex(idraw,(btVector3 *)((long)(&pNVar9->m_x + -6) + lVar21),0.25,&d);
      }
      lVar21 = lVar21 + 0x78;
    }
  }
  if ((char)local_1cc < '\0') {
    lVar21 = 0x28;
    lVar19 = 0x48;
    for (lVar22 = 0; lVar22 < (psb->m_notes).m_size; lVar22 = lVar22 + 1) {
      pNVar7 = (psb->m_notes).m_data;
      d.m_floats = *&pNVar7[lVar22].m_offset.m_floats;
      local_188._0_8_ = lVar19;
      s = (btScalar *)((long)&(((Note *)(&pNVar7->m_offset + -1))->super_Element).m_tag + lVar19);
      local_178[0] = (btScalar)(int)lVar21;
      local_178[1] = (btScalar)(int)((ulong)lVar21 >> 0x20);
      for (lVar19 = 0; uVar29 = in_XMM1._8_8_, lVar19 < pNVar7[lVar22].m_rank; lVar19 = lVar19 + 1)
      {
        bVar33 = operator*((btVector3 *)
                           (*(long *)((long)&(&((Note *)(&pNVar7->m_offset + -1))->super_Element)
                                             [lVar19].m_tag + lVar21) + 0x10),s);
        bVar32 = d;
        auVar28._0_8_ = bVar33.m_floats._8_8_;
        auVar28._8_8_ = uVar29;
        fVar30 = d.m_floats[0];
        d.m_floats[1] = d.m_floats[1] + bVar33.m_floats[1];
        d.m_floats[0] = fVar30 + bVar33.m_floats[0];
        d.m_floats[2] = bVar32.m_floats[2];
        in_XMM1._4_12_ = auVar28._4_12_;
        in_XMM1[0] = bVar33.m_floats[2] + d.m_floats[2];
        d.m_floats[3] = bVar32.m_floats[3];
        d.m_floats[2] = in_XMM1[0];
        s = s + 1;
      }
      (*idraw->_vptr_btIDebugDraw[0xc])(idraw,&d,pNVar7[lVar22].m_text);
      lVar19 = local_188._0_8_ + 0x58;
      lVar21 = local_178._0_8_ + 0x58;
    }
  }
  uVar12 = local_1cc;
  if ((local_1cc >> 9 & 1) != 0) {
    DrawNodeTree(psb,idraw,0,-1);
  }
  if ((uVar12 >> 10 & 1) != 0) {
    DrawFaceTree(psb,idraw,0,-1);
  }
  if ((uVar12 >> 0xb & 1) != 0) {
    DrawClusterTree(psb,idraw,0,-1);
  }
  if ((uVar12 >> 0xc & 1) != 0) {
    for (lVar21 = 0; lVar21 < (psb->m_joints).m_size; lVar21 = lVar21 + 1) {
      pJVar8 = (psb->m_joints).m_data[lVar21];
      iVar16 = (*pJVar8->_vptr_Joint[5])(pJVar8);
      uVar29 = in_XMM1._8_8_;
      if (iVar16 == 1) {
        pbVar18 = btSoftBody::Body::xform(pJVar8->m_bodies);
        d.m_floats = *&(pbVar18->m_origin).m_floats;
        pbVar18 = btSoftBody::Body::xform(pJVar8->m_bodies + 1);
        x.m_floats = *&(pbVar18->m_origin).m_floats;
        pbVar18 = btSoftBody::Body::xform(pJVar8->m_bodies);
        bVar32 = operator*(&pbVar18->m_basis,pJVar8->m_refs);
        local_178[2] = (btScalar)extraout_XMM0_Dc_00;
        local_178._0_8_ = bVar32.m_floats._0_8_;
        local_178[3] = (btScalar)extraout_XMM0_Dd_00;
        local_188._8_8_ = uVar29;
        local_188._0_8_ = bVar32.m_floats._8_8_;
        pbVar18 = btSoftBody::Body::xform(pJVar8->m_bodies + 1);
        bVar32 = operator*(&pbVar18->m_basis,pJVar8->m_refs + 1);
        local_168._8_4_ = extraout_XMM0_Dc_01;
        local_168._0_8_ = bVar32.m_floats._0_8_;
        fStack_15c = (float)extraout_XMM0_Dd_01;
        local_158._8_8_ = uVar29;
        local_158._0_8_ = bVar32.m_floats._8_8_;
        local_188._0_4_ = (float)local_188._0_4_ * 10.0;
        local_178[0] = local_178[0] * 10.0;
        local_178[1] = local_178[1] * 10.0;
        local_178[2] = local_178[2] * 0.0;
        local_178[3] = local_178[3] * 0.0;
        local_1e8.m_floats[1] = d.m_floats[1] + local_178[1];
        local_1e8.m_floats[0] = d.m_floats[0] + local_178[0];
        local_1e8.m_floats[2] = d.m_floats[2] + (float)local_188._0_4_;
        local_1e8.m_floats[3] = 0.0;
        local_1a8.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&d,&local_1e8,&local_1a8);
        local_158._0_4_ = (float)local_158._0_4_ * 10.0;
        local_168._0_4_ = (float)local_168._0_4_ * 10.0;
        local_168._4_4_ = (float)local_168._4_4_ * 10.0;
        local_168._8_4_ = (float)local_168._8_4_ * 0.0;
        fStack_15c = fStack_15c * 0.0;
        local_1e8.m_floats[1] = d.m_floats[1] + (float)local_168._4_4_;
        local_1e8.m_floats[0] = d.m_floats[0] + (float)local_168._0_4_;
        local_1e8.m_floats[2] = d.m_floats[2] + (float)local_158._0_4_;
        local_1e8.m_floats[3] = 0.0;
        local_1a8.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&d,&local_1e8,&local_1a8);
        local_1e8.m_floats[1] = x.m_floats[1] + local_178[1];
        local_1e8.m_floats[0] = x.m_floats[0] + local_178[0];
        local_1e8.m_floats[2] = local_188._0_4_ + x.m_floats[2];
        local_1e8.m_floats[3] = 0.0;
        local_1a8.m_floats[2] = 1.0;
        local_1a8.m_floats[0] = 0.0;
        local_1a8.m_floats[1] = 1.0;
        local_1a8.m_floats[3] = 0.0;
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&x,&local_1e8,&local_1a8);
        fVar30 = local_158._0_4_ + x.m_floats[2];
        in_XMM1 = (btScalar  [4])ZEXT416((uint)fVar30);
        local_1e8.m_floats[1] = x.m_floats[1] + (float)local_168._4_4_;
        local_1e8.m_floats[0] = x.m_floats[0] + (float)local_168._0_4_;
        local_1e8.m_floats[2] = fVar30;
        local_1e8.m_floats[3] = 0.0;
        local_1a8.m_floats[2] = 1.0;
        local_1a8.m_floats[0] = 0.0;
        local_1a8.m_floats[1] = 1.0;
        local_1a8.m_floats[3] = 0.0;
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&x,&local_1e8,&local_1a8);
      }
      else if (iVar16 == 0) {
        pbVar18 = btSoftBody::Body::xform(pJVar8->m_bodies);
        d = btTransform::operator()(pbVar18,pJVar8->m_refs);
        pbVar18 = btSoftBody::Body::xform(pJVar8->m_bodies + 1);
        x = btTransform::operator()(pbVar18,pJVar8->m_refs + 1);
        in_XMM1._0_8_ = x.m_floats._8_8_;
        in_XMM1[2] = (btScalar)(int)uVar29;
        in_XMM1[3] = (btScalar)(int)((ulong)uVar29 >> 0x20);
        pbVar18 = btSoftBody::Body::xform(pJVar8->m_bodies);
        local_1e8.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&pbVar18->m_origin,&d,&local_1e8);
        pbVar18 = btSoftBody::Body::xform(pJVar8->m_bodies + 1);
        local_1e8.m_floats[2] = 1.0;
        local_1e8.m_floats[0] = 0.0;
        local_1e8.m_floats[1] = 1.0;
        local_1e8.m_floats[3] = 0.0;
        (*idraw->_vptr_btIDebugDraw[4])(idraw,&pbVar18->m_origin,&x,&local_1e8);
        local_1e8.m_floats = (btScalar  [4])ZEXT816(0x3f8000003f800000);
        drawVertex(idraw,&d,0.25,&local_1e8);
        local_1e8.m_floats[2] = 1.0;
        local_1e8.m_floats[3] = 0.0;
        local_1e8.m_floats[0] = 0.0;
        local_1e8.m_floats[1] = 1.0;
        drawVertex(idraw,&x,0.25,&local_1e8);
      }
    }
  }
  return;
}

Assistant:

void			btSoftBodyHelpers::Draw(	btSoftBody* psb,
										btIDebugDraw* idraw,
										int drawflags)
{
	const btScalar		scl=(btScalar)0.1;
	const btScalar		nscl=scl*5;
	const btVector3		lcolor=btVector3(0,0,0);
	const btVector3		ncolor=btVector3(1,1,1);
	const btVector3		ccolor=btVector3(1,0,0);
	int i,j,nj;

		/* Clusters	*/ 
	if(0!=(drawflags&fDrawFlags::Clusters))
	{
		srand(1806);
		for(i=0;i<psb->m_clusters.size();++i)
		{
			if(psb->m_clusters[i]->m_collide)
			{
				btVector3						color(	rand()/(btScalar)RAND_MAX,
					rand()/(btScalar)RAND_MAX,
					rand()/(btScalar)RAND_MAX);
				color=color.normalized()*0.75;
				btAlignedObjectArray<btVector3>	vertices;
				vertices.resize(psb->m_clusters[i]->m_nodes.size());
				for(j=0,nj=vertices.size();j<nj;++j)
				{				
					vertices[j]=psb->m_clusters[i]->m_nodes[j]->m_x;
				}
#define USE_NEW_CONVEX_HULL_COMPUTER
#ifdef USE_NEW_CONVEX_HULL_COMPUTER
				btConvexHullComputer	computer;
				int stride = sizeof(btVector3);
				int count = vertices.size();
				btScalar shrink=0.f;
				btScalar shrinkClamp=0.f;
				computer.compute(&vertices[0].getX(),stride,count,shrink,shrinkClamp);
				for (int i=0;i<computer.faces.size();i++)
				{

					int face = computer.faces[i];
					//printf("face=%d\n",face);
					const btConvexHullComputer::Edge*  firstEdge = &computer.edges[face];
					const btConvexHullComputer::Edge*  edge = firstEdge->getNextEdgeOfFace();

					int v0 = firstEdge->getSourceVertex();
					int v1 = firstEdge->getTargetVertex();
					while (edge!=firstEdge)
					{
						int v2 = edge->getTargetVertex();
						idraw->drawTriangle(computer.vertices[v0],computer.vertices[v1],computer.vertices[v2],color,1);
						edge = edge->getNextEdgeOfFace();
						v0=v1;
						v1=v2;
					};
				}
#else

				HullDesc		hdsc(QF_TRIANGLES,vertices.size(),&vertices[0]);
				HullResult		hres;
				HullLibrary		hlib;
				hdsc.mMaxVertices=vertices.size();
				hlib.CreateConvexHull(hdsc,hres);
				const btVector3	center=average(hres.m_OutputVertices);
				add(hres.m_OutputVertices,-center);
				mul(hres.m_OutputVertices,(btScalar)1);
				add(hres.m_OutputVertices,center);
				for(j=0;j<(int)hres.mNumFaces;++j)
				{
					const int idx[]={hres.m_Indices[j*3+0],hres.m_Indices[j*3+1],hres.m_Indices[j*3+2]};
					idraw->drawTriangle(hres.m_OutputVertices[idx[0]],
						hres.m_OutputVertices[idx[1]],
						hres.m_OutputVertices[idx[2]],
						color,1);
				}
				hlib.ReleaseResult(hres);
#endif

			}
			/* Velocities	*/ 
#if 0
			for(int j=0;j<psb->m_clusters[i].m_nodes.size();++j)
			{
				const btSoftBody::Cluster&	c=psb->m_clusters[i];
				const btVector3				r=c.m_nodes[j]->m_x-c.m_com;
				const btVector3				v=c.m_lv+btCross(c.m_av,r);
				idraw->drawLine(c.m_nodes[j]->m_x,c.m_nodes[j]->m_x+v,btVector3(1,0,0));
			}
#endif
			/* Frame		*/ 
	//		btSoftBody::Cluster& c=*psb->m_clusters[i];
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(10,0,0),btVector3(1,0,0));
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(0,10,0),btVector3(0,1,0));
	//		idraw->drawLine(c.m_com,c.m_framexform*btVector3(0,0,10),btVector3(0,0,1));
		}
	}
	else
	{
		/* Nodes	*/ 
		if(0!=(drawflags&fDrawFlags::Nodes))
		{
			for(i=0;i<psb->m_nodes.size();++i)
			{
				const btSoftBody::Node&	n=psb->m_nodes[i];
				if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				idraw->drawLine(n.m_x-btVector3(scl,0,0),n.m_x+btVector3(scl,0,0),btVector3(1,0,0));
				idraw->drawLine(n.m_x-btVector3(0,scl,0),n.m_x+btVector3(0,scl,0),btVector3(0,1,0));
				idraw->drawLine(n.m_x-btVector3(0,0,scl),n.m_x+btVector3(0,0,scl),btVector3(0,0,1));
			}
		}
		/* Links	*/ 
		if(0!=(drawflags&fDrawFlags::Links))
		{
			for(i=0;i<psb->m_links.size();++i)
			{
				const btSoftBody::Link&	l=psb->m_links[i];
				if(0==(l.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				idraw->drawLine(l.m_n[0]->m_x,l.m_n[1]->m_x,lcolor);
			}
		}
		/* Normals	*/ 
		if(0!=(drawflags&fDrawFlags::Normals))
		{
			for(i=0;i<psb->m_nodes.size();++i)
			{
				const btSoftBody::Node&	n=psb->m_nodes[i];
				if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
				const btVector3			d=n.m_n*nscl;
				idraw->drawLine(n.m_x,n.m_x+d,ncolor);
				idraw->drawLine(n.m_x,n.m_x-d,ncolor*0.5);
			}
		}
		/* Contacts	*/ 
		if(0!=(drawflags&fDrawFlags::Contacts))
		{
			static const btVector3		axis[]={btVector3(1,0,0),
				btVector3(0,1,0),
				btVector3(0,0,1)};
			for(i=0;i<psb->m_rcontacts.size();++i)
			{		
				const btSoftBody::RContact&	c=psb->m_rcontacts[i];
				const btVector3				o=	c.m_node->m_x-c.m_cti.m_normal*
					(btDot(c.m_node->m_x,c.m_cti.m_normal)+c.m_cti.m_offset);
				const btVector3				x=btCross(c.m_cti.m_normal,axis[c.m_cti.m_normal.minAxis()]).normalized();
				const btVector3				y=btCross(x,c.m_cti.m_normal).normalized();
				idraw->drawLine(o-x*nscl,o+x*nscl,ccolor);
				idraw->drawLine(o-y*nscl,o+y*nscl,ccolor);
				idraw->drawLine(o,o+c.m_cti.m_normal*nscl*3,btVector3(1,1,0));
			}
		}
		/* Faces	*/ 
	if(0!=(drawflags&fDrawFlags::Faces))
	{
		const btScalar	scl=(btScalar)0.8;
		const btScalar	alp=(btScalar)1;
		const btVector3	col(0,(btScalar)0.7,0);
		for(i=0;i<psb->m_faces.size();++i)
		{
			const btSoftBody::Face&	f=psb->m_faces[i];
			if(0==(f.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			const btVector3			x[]={f.m_n[0]->m_x,f.m_n[1]->m_x,f.m_n[2]->m_x};
			const btVector3			c=(x[0]+x[1]+x[2])/3;
			idraw->drawTriangle((x[0]-c)*scl+c,
				(x[1]-c)*scl+c,
				(x[2]-c)*scl+c,
				col,alp);
		}	
	}
	/* Tetras	*/ 
	if(0!=(drawflags&fDrawFlags::Tetras))
	{
		const btScalar	scl=(btScalar)0.8;
		const btScalar	alp=(btScalar)1;
		const btVector3	col((btScalar)0.3,(btScalar)0.3,(btScalar)0.7);
		for(int i=0;i<psb->m_tetras.size();++i)
		{
			const btSoftBody::Tetra&	t=psb->m_tetras[i];
			if(0==(t.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			const btVector3				x[]={t.m_n[0]->m_x,t.m_n[1]->m_x,t.m_n[2]->m_x,t.m_n[3]->m_x};
			const btVector3				c=(x[0]+x[1]+x[2]+x[3])/4;
			idraw->drawTriangle((x[0]-c)*scl+c,(x[1]-c)*scl+c,(x[2]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[0]-c)*scl+c,(x[1]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[1]-c)*scl+c,(x[2]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
			idraw->drawTriangle((x[2]-c)*scl+c,(x[0]-c)*scl+c,(x[3]-c)*scl+c,col,alp);
		}	
	}
	}
	/* Anchors	*/ 
	if(0!=(drawflags&fDrawFlags::Anchors))
	{
		for(i=0;i<psb->m_anchors.size();++i)
		{
			const btSoftBody::Anchor&	a=psb->m_anchors[i];
			const btVector3				q=a.m_body->getWorldTransform()*a.m_local;
			drawVertex(idraw,a.m_node->m_x,0.25,btVector3(1,0,0));
			drawVertex(idraw,q,0.25,btVector3(0,1,0));
			idraw->drawLine(a.m_node->m_x,q,btVector3(1,1,1));
		}
		for(i=0;i<psb->m_nodes.size();++i)
		{
			const btSoftBody::Node&	n=psb->m_nodes[i];		
			if(0==(n.m_material->m_flags&btSoftBody::fMaterial::DebugDraw)) continue;
			if(n.m_im<=0)
			{
				drawVertex(idraw,n.m_x,0.25,btVector3(1,0,0));
			}
		}
	}
	

	/* Notes	*/ 
	if(0!=(drawflags&fDrawFlags::Notes))
	{
		for(i=0;i<psb->m_notes.size();++i)
		{
			const btSoftBody::Note&	n=psb->m_notes[i];
			btVector3				p=n.m_offset;
			for(int j=0;j<n.m_rank;++j)
			{
				p+=n.m_nodes[j]->m_x*n.m_coords[j];
			}
			idraw->draw3dText(p,n.m_text);
		}
	}
	/* Node tree	*/ 
	if(0!=(drawflags&fDrawFlags::NodeTree))		DrawNodeTree(psb,idraw);
	/* Face tree	*/ 
	if(0!=(drawflags&fDrawFlags::FaceTree))		DrawFaceTree(psb,idraw);
	/* Cluster tree	*/ 
	if(0!=(drawflags&fDrawFlags::ClusterTree))	DrawClusterTree(psb,idraw);
	/* Joints		*/ 
	if(0!=(drawflags&fDrawFlags::Joints))
	{
		for(i=0;i<psb->m_joints.size();++i)
		{
			const btSoftBody::Joint*	pj=psb->m_joints[i];
			switch(pj->Type())
			{
			case	btSoftBody::Joint::eType::Linear:
				{
					const btSoftBody::LJoint*	pjl=(const btSoftBody::LJoint*)pj;
					const btVector3	a0=pj->m_bodies[0].xform()*pjl->m_refs[0];
					const btVector3	a1=pj->m_bodies[1].xform()*pjl->m_refs[1];
					idraw->drawLine(pj->m_bodies[0].xform().getOrigin(),a0,btVector3(1,1,0));
					idraw->drawLine(pj->m_bodies[1].xform().getOrigin(),a1,btVector3(0,1,1));
					drawVertex(idraw,a0,0.25,btVector3(1,1,0));
					drawVertex(idraw,a1,0.25,btVector3(0,1,1));
				}
				break;
			case	btSoftBody::Joint::eType::Angular:
				{
					//const btSoftBody::AJoint*	pja=(const btSoftBody::AJoint*)pj;
					const btVector3	o0=pj->m_bodies[0].xform().getOrigin();
					const btVector3	o1=pj->m_bodies[1].xform().getOrigin();
					const btVector3	a0=pj->m_bodies[0].xform().getBasis()*pj->m_refs[0];
					const btVector3	a1=pj->m_bodies[1].xform().getBasis()*pj->m_refs[1];
					idraw->drawLine(o0,o0+a0*10,btVector3(1,1,0));
					idraw->drawLine(o0,o0+a1*10,btVector3(1,1,0));
					idraw->drawLine(o1,o1+a0*10,btVector3(0,1,1));
					idraw->drawLine(o1,o1+a1*10,btVector3(0,1,1));
					break;
				}
				default:
				{
				}
					
			}		
		}
	}
}